

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O0

void __thiscall TGAImage::scale(TGAImage *this,size_t w,size_t h)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  size_type sVar6;
  long lVar7;
  uchar *puVar8;
  uchar *puVar9;
  uint local_74;
  int local_70;
  uint32_t i;
  int ox;
  int nx;
  int errx;
  uint32_t j;
  int olinebytes;
  int n_line_bytes;
  int err_y;
  int oscanline;
  int n_scanline;
  allocator<unsigned_char> local_3a;
  value_type_conflict local_39;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> tdata;
  size_t h_local;
  size_t w_local;
  TGAImage *this_local;
  
  if (((w != 0) && (h != 0)) &&
     (tdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)h,
     sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data),
     sVar6 != 0)) {
    lVar7 = w * (long)tdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
    uVar1 = this->bytespp;
    local_39 = '\0';
    std::allocator<unsigned_char>::allocator(&local_3a);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
               lVar7 * (ulong)uVar1,&local_39,&local_3a);
    std::allocator<unsigned_char>::~allocator(&local_3a);
    err_y = 0;
    n_line_bytes = 0;
    olinebytes = 0;
    uVar4 = (uint32_t)w;
    iVar5 = uVar4 * this->bytespp;
    uVar2 = this->width;
    uVar3 = this->bytespp;
    for (nx = 0; (uint)nx < this->height; nx = nx + 1) {
      ox = this->width - uVar4;
      i = -this->bytespp;
      local_70 = -this->bytespp;
      for (local_74 = 0; local_74 < this->width; local_74 = local_74 + 1) {
        local_70 = this->bytespp + local_70;
        ox = ox + uVar4;
        while ((int)this->width <= ox) {
          ox = ox - this->width;
          i = this->bytespp + i;
          puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
          puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
          memcpy(puVar8 + (long)(int)i + (long)err_y,puVar9 + (long)local_70 + (long)n_line_bytes,
                 (ulong)this->bytespp);
        }
      }
      n_line_bytes = uVar2 * uVar3 + n_line_bytes;
      for (olinebytes = olinebytes +
                        (int)tdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (int)this->height <= olinebytes; olinebytes = olinebytes - this->height) {
        if (SBORROW4(olinebytes,this->height * 2) == (int)(olinebytes + this->height * -2) < 0) {
          puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
          puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
          memcpy(puVar8 + (long)iVar5 + (long)err_y,puVar9 + err_y,(long)iVar5);
        }
        err_y = iVar5 + err_y;
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    this->width = uVar4;
    this->height = (uint32_t)
                   tdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  }
  return;
}

Assistant:

void TGAImage::scale(size_t w, size_t h)
{
    if (w <= 0 || h <= 0 || !data.size()) return;
    std::vector<std::uint8_t> tdata(w * h * bytespp, 0);
    int n_scanline = 0;
    int oscanline = 0;
    int err_y = 0;
    int n_line_bytes = w * bytespp;
    int olinebytes = width * bytespp;
    for (uint32_t j = 0; j < height; j++) {
        int errx = width - w;
        int nx = -static_cast<int>(bytespp);
        int ox = -static_cast<int>(bytespp);
        for (uint32_t i = 0; i < width; i++) {
            ox += bytespp;
            errx += w;
            while (errx >= (int)width) {
                errx -= width;
                nx += bytespp;
                memcpy(tdata.data() + n_scanline + nx, data.data() + oscanline + ox, bytespp);
            }
        }
        err_y += h;
        oscanline += olinebytes;
        while (err_y >= (int)height) {
            if (err_y >= (int)height << 1)  // it means we jump over a scanline
                memcpy(tdata.data() + n_scanline + n_line_bytes, tdata.data() + n_scanline,
                       n_line_bytes);
            err_y -= height;
            n_scanline += n_line_bytes;
        }
    }
    data = tdata;
    width = (uint32_t)w;
    height = (uint32_t)h;
}